

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

void curl_global_cleanup(void)

{
  if (initialized != 0) {
    initialized = initialized - 1;
    if (initialized == 0) {
      if (init_ssl == '\x01') {
        (*Curl_ssl->cleanup)();
        init_ssl = '\0';
      }
      return;
    }
  }
  return;
}

Assistant:

void curl_global_cleanup(void)
{
  if(!initialized)
    return;

  if(--initialized)
    return;

  Curl_ssl_cleanup();
  Curl_resolver_global_cleanup();

#ifdef WIN32
  Curl_win32_cleanup(init_flags);
#endif

  Curl_amiga_cleanup();

#if defined(USE_LIBSSH2) && defined(HAVE_LIBSSH2_EXIT)
  (void)libssh2_exit();
#endif

#if defined(USE_LIBSSH)
  (void)ssh_finalize();
#endif

  init_flags  = 0;
}